

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

void __thiscall
t_markdown_generator::generate_typedef(t_markdown_generator *this,t_typedef *ttypedef)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  t_type *ttype;
  string name;
  
  iVar2 = (*(ttypedef->super_t_type).super_t_doc._vptr_t_doc[3])(ttypedef);
  std::__cxx11::string::string((string *)&name,(string *)CONCAT44(extraout_var,iVar2));
  poVar1 = &this->f_out_;
  poVar3 = std::operator<<((ostream *)poVar1,"### Typedef: ");
  poVar3 = std::operator<<(poVar3,(string *)&name);
  std::operator<<(poVar3,'\n');
  print_doc(this,(t_doc *)ttypedef);
  poVar3 = std::operator<<((ostream *)poVar1,'\n');
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)poVar1,"_Base type_: **");
  ttype = t_typedef::get_type(ttypedef);
  print_type(this,ttype);
  poVar3 = std::operator<<((ostream *)poVar1,"**");
  poVar3 = std::operator<<(poVar3,'\n');
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)poVar1,'\n');
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_markdown_generator::generate_typedef(t_typedef* ttypedef) {
  string name = ttypedef->get_name();
  f_out_ << "### Typedef: " << name  << endl;
  print_doc(ttypedef);
  f_out_ << endl << endl;
  f_out_ << "_Base type_: **";
  print_type(ttypedef->get_type());
  f_out_ << "**" << endl << endl;
  f_out_ << endl;
}